

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

int noconflict(ASMState *as,IRRef ref,IROp conflict,int check)

{
  IRIns *pIVar1;
  uint local_34;
  IRRef i;
  IRIns *ir;
  int check_local;
  IROp conflict_local;
  IRRef ref_local;
  ASMState *as_local;
  
  pIVar1 = as->ir;
  local_34 = as->curins;
  if (local_34 <= ref + 0x1f) {
    do {
      local_34 = local_34 - 1;
      if (local_34 <= ref) {
        return 1;
      }
      if (*(byte *)((long)pIVar1 + (ulong)local_34 * 8 + 5) == conflict) {
        return 0;
      }
      if (((check & 1U) != 0) &&
         ((*(char *)((long)pIVar1 + (ulong)local_34 * 8 + 5) == ';' ||
          (*(char *)((long)pIVar1 + (ulong)local_34 * 8 + 5) == 'b')))) {
        return 0;
      }
    } while (((check & 2U) == 0) ||
            ((pIVar1[local_34].field_0.op1 != ref &&
             (*(ushort *)((long)pIVar1 + (ulong)local_34 * 8 + 2) != ref))));
  }
  return 0;
}

Assistant:

static int noconflict(ASMState *as, IRRef ref, IROp conflict, int check)
{
  IRIns *ir = as->ir;
  IRRef i = as->curins;
  if (i > ref + CONFLICT_SEARCH_LIM)
    return 0;  /* Give up, ref is too far away. */
  while (--i > ref) {
    if (ir[i].o == conflict)
      return 0;  /* Conflict found. */
    else if ((check & 1) && (ir[i].o == IR_NEWREF || ir[i].o == IR_CALLS))
      return 0;
    else if ((check & 2) && (ir[i].op1 == ref || ir[i].op2 == ref))
      return 0;
  }
  return 1;  /* Ok, no conflict. */
}